

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::doWalkFunction(I64ToI32Lowering *this,Function *func)

{
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *this_00;
  Module *pMVar1;
  pointer pTVar2;
  undefined1 auVar3 [16];
  Function *pFVar4;
  Index IVar5;
  bool bVar6;
  Index IVar7;
  pointer __p;
  pointer __p_00;
  Function *pFVar8;
  size_t sVar9;
  wasm *this_01;
  Type TVar10;
  mapped_type *pmVar11;
  uint uVar12;
  code *pcVar13;
  mapped_type mVar14;
  Name NVar15;
  _Head_base<0UL,_wasm::Builder_*,_false> in_stack_fffffffffffffb68;
  Module temp;
  _Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_88;
  string_view local_68;
  Function *local_58;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  Function *local_48;
  I64ToI32Lowering *local_40;
  mapped_type local_38;
  Index local_34;
  
  Flat::verifyFlatness(func);
  local_40 = this;
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    this_00 = &this->builder;
    pMVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
             ).
             super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             currModule;
    __p_00 = (pointer)operator_new(8);
    this = local_40;
    __p_00->wasm = pMVar1;
    in_stack_fffffffffffffb68._M_head_impl = (Builder *)0x0;
    std::__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>::reset
              ((__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_> *)this_00,__p_00
              );
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)
               &stack0xfffffffffffffb68);
  }
  local_50 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->indexMap;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_50);
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->highBitVars)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->freeTemps)._M_h);
  Module::Module((Module *)&stack0xfffffffffffffb68);
  local_88._M_engaged = false;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = &temp.tagsMap._M_h._M_single_bucket;
  pFVar8 = wasm::ModuleUtils::copyFunction
                     ((ModuleUtils *)func,(Function *)&stack0xfffffffffffffb68,(Module *)0x0,
                      (Name)(auVar3 << 0x40),
                      (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                      &local_88,
                      (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                      in_stack_fffffffffffffb68._M_head_impl);
  std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::_M_reset
            (&local_88);
  std::_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             &temp.tagsMap._M_h._M_single_bucket);
  Function::setParams(func,(Type)0x0);
  pTVar2 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(func->localNames)._M_h);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(func->localIndices)._M_h);
  Names::ensureNames(pFVar8);
  uVar12 = 0;
  mVar14 = 0;
  local_58 = pFVar8;
  local_48 = func;
  while( true ) {
    pFVar8 = local_58;
    local_34 = uVar12;
    sVar9 = Function::getNumLocals(local_58);
    pFVar4 = local_48;
    if (sVar9 <= uVar12) {
      sVar9 = Function::getNumLocals(local_48);
      local_40->nextTemp = (Index)sVar9;
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::walk
                (&(local_40->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,&pFVar4->body);
      Module::~Module((Module *)&stack0xfffffffffffffb68);
      return;
    }
    bVar6 = Function::hasLocalName(pFVar8,local_34);
    if (!bVar6) break;
    NVar15 = Function::getLocalName(pFVar8,local_34);
    this_01 = NVar15.super_IString.str._M_len;
    NVar15.super_IString.str._M_len = (size_t)NVar15.super_IString.str._M_str;
    local_68 = (string_view)makeHighName(this_01,NVar15);
    local_38 = mVar14;
    TVar10 = Function::getLocalType(pFVar8,local_34);
    IVar5 = local_34;
    IVar7 = Function::getVarIndexBase(pFVar8);
    pcVar13 = Builder::addVar;
    if (IVar5 < IVar7) {
      pcVar13 = Builder::addParam;
    }
    if (TVar10.id == 3) {
      (*pcVar13)(local_48,this_01,NVar15.super_IString.str._M_str,2);
      (*pcVar13)(local_48,local_68._M_len,local_68._M_str,2);
      pmVar11 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_50,&local_34);
      *pmVar11 = local_38;
      mVar14 = local_38 + 2;
    }
    else {
      (*pcVar13)(local_48,this_01,NVar15.super_IString.str._M_str,TVar10.id);
      pmVar11 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_50,&local_34);
      *pmVar11 = local_38;
      mVar14 = local_38 + 1;
    }
    uVar12 = local_34 + 1;
  }
  __assert_fail("oldFunc->hasLocalName(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0xae,"void wasm::I64ToI32Lowering::doWalkFunction(Function *)");
}

Assistant:

void doWalkFunction(Function* func) {
    Flat::verifyFlatness(func);
    // create builder here if this is first entry to module for this object
    if (!builder) {
      builder = std::make_unique<Builder>(*getModule());
    }
    indexMap.clear();
    highBitVars.clear();
    freeTemps.clear();
    Module temp;
    auto* oldFunc = ModuleUtils::copyFunction(func, temp);
    func->setParams(Type::none);
    func->vars.clear();
    func->localNames.clear();
    func->localIndices.clear();
    Index newIdx = 0;
    Names::ensureNames(oldFunc);
    for (Index i = 0; i < oldFunc->getNumLocals(); ++i) {
      assert(oldFunc->hasLocalName(i));
      Name lowName = oldFunc->getLocalName(i);
      Name highName = makeHighName(lowName);
      Type paramType = oldFunc->getLocalType(i);
      auto builderFunc =
        (i < oldFunc->getVarIndexBase())
          ? Builder::addParam
          : static_cast<Index (*)(Function*, Name, Type)>(Builder::addVar);
      if (paramType == Type::i64) {
        builderFunc(func, lowName, Type::i32);
        builderFunc(func, highName, Type::i32);
        indexMap[i] = newIdx;
        newIdx += 2;
      } else {
        builderFunc(func, lowName, paramType);
        indexMap[i] = newIdx++;
      }
    }
    nextTemp = func->getNumLocals();
    PostWalker<I64ToI32Lowering>::doWalkFunction(func);
  }